

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void util::
     hex_dump<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                it,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   itEnd,int start_offset,colour *pColours,size_t per_line)

{
  colour c;
  byte bVar1;
  byte bVar2;
  int iVar3;
  LogHelper *pLVar4;
  ulong uVar5;
  colour cVar6;
  ulong uVar7;
  size_t sVar8;
  byte *pbVar9;
  char local_79;
  colour *local_78;
  uint local_6c;
  ulong local_68;
  size_t local_60;
  byte *local_58;
  string text;
  
  if (per_line == 0) {
    __assert_fail("per_line != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/include/utils.h"
                  ,0xec,
                  "void util::hex_dump(ForwardIter, ForwardIter, int, colour *, size_t) [ForwardIter = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  uVar7 = (ulong)start_offset;
  pbVar9 = it._M_current + uVar7;
  local_78 = pColours + uVar7;
  if (pColours == (colour *)0x0) {
    local_78 = (colour *)0x0;
  }
  cVar6 = none;
  uVar5 = uVar7 % per_line;
  uVar7 = uVar7 - uVar5;
  local_60 = per_line;
  local_58 = itEnd._M_current;
  while (pbVar9 < itEnd._M_current) {
    text._M_dataplus._M_p = (pointer)&text.field_2;
    std::__cxx11::string::_M_construct((ulong)&text,(char)per_line);
    if (cVar6 != none) {
      operator<<((LogHelper *)&cout,none);
    }
    pLVar4 = operator<<((LogHelper *)&cout,"0123456789ABCDEF" + ((uint)(uVar7 >> 0xc) & 0xf));
    pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + ((uint)(uVar7 >> 8) & 0xf));
    pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + ((uint)(uVar7 >> 4) & 0xf));
    pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + ((uint)uVar7 & 0xf));
    operator<<(pLVar4,(char (*) [3])0x1a7fbd);
    local_68 = uVar7 + per_line;
    local_6c = (int)uVar5 - (int)per_line;
    cVar6 = none;
    for (sVar8 = 0; per_line != sVar8; sVar8 = sVar8 + 1) {
      if (pbVar9 < itEnd._M_current && (int)uVar5 < 1) {
        if (local_78 == (colour *)0x0) {
          local_78 = (colour *)0x0;
        }
        else {
          c = *local_78;
          local_78 = local_78 + 1;
          if (c != cVar6) {
            operator<<((LogHelper *)&cout,c);
            cVar6 = c;
          }
        }
        bVar1 = *pbVar9;
        iVar3 = isprint((uint)bVar1);
        bVar2 = bVar1;
        if (iVar3 == 0) {
          bVar2 = 0x2e;
        }
        text._M_dataplus._M_p[sVar8] = bVar2;
        pLVar4 = operator<<((LogHelper *)&cout,"0123456789ABCDEF" + (bVar1 >> 4));
        pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + (bVar1 & 0xf));
        local_79 = ' ';
        operator<<(pLVar4,&local_79);
        pbVar9 = pbVar9 + 1;
        per_line = local_60;
        itEnd._M_current = local_58;
      }
      else {
        operator<<((LogHelper *)&cout,(char (*) [4])0x1a7fbc);
      }
      uVar5 = (ulong)((int)uVar5 - 1);
    }
    pLVar4 = operator<<((LogHelper *)&cout,none);
    uVar7 = local_68;
    pLVar4 = operator<<(pLVar4,(char (*) [2])0x1a7fbe);
    pLVar4 = operator<<(pLVar4,&text);
    operator<<(pLVar4,(char (*) [2])0x1a83c6);
    std::__cxx11::string::~string((string *)&text);
    uVar5 = (ulong)local_6c;
  }
  return;
}

Assistant:

void hex_dump(ForwardIter it, ForwardIter itEnd, int start_offset = 0, colour* pColours = nullptr, size_t per_line = 16)
{
    assert(per_line != 0);
    static const char hex[] = "0123456789ABCDEF";

    it += start_offset;
    if (pColours)
        pColours += start_offset;

    colour c = colour::none;
    auto base_offset = start_offset - (start_offset % per_line);
    start_offset %= per_line;

    while (it < itEnd)
    {
        std::string text(per_line, ' ');

        if (c != colour::none)
        {
            util::cout << colour::none;
            c = colour::none;
        }

        util::cout << hex[(base_offset >> 12) & 0xf] <<
            hex[(base_offset >> 8) & 0xf] <<
            hex[(base_offset >> 4) & 0xf] <<
            hex[base_offset & 0xf] << "  ";

        base_offset += per_line;

        for (size_t i = 0; i < per_line; i++)
        {
            if (start_offset-- <= 0 && it < itEnd)
            {
                if (pColours)
                {
                    auto new_colour = *pColours++;
                    if (new_colour != c)
                    {
                        util::cout << new_colour;
                        c = new_colour;
                    }
                }

                auto b = *it++;
                text[i] = std::isprint(b) ? b : '.';
                util::cout << hex[b >> 4] << hex[b & 0x0f] << ' ';
            }
            else
            {
                util::cout << "   ";
            }
        }

        util::cout << colour::none << " " << text << "\n";
    }
}